

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_mem.cpp
# Opt level: O2

RK_U32 mpp_mem_total_now(void)

{
  RK_U32 RVar1;
  MppMemService *pMVar2;
  AutoMutex auto_lock;
  Autolock local_18;
  
  pMVar2 = MppMemService::get_inst();
  local_18.mLock = pMVar2->m_lock;
  local_18.mEnabled = 1;
  if ((pthread_mutex_t *)local_18.mLock != (pthread_mutex_t *)0x0) {
    pthread_mutex_lock((pthread_mutex_t *)local_18.mLock);
  }
  RVar1 = pMVar2->m_total_size;
  Mutex::Autolock::~Autolock(&local_18);
  return RVar1;
}

Assistant:

RK_U32 mpp_mem_total_now()
{
    MppMemService *srv = MppMemService::get_inst();
    AutoMutex auto_lock(srv->m_lock);

    return srv->total_now();
}